

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktxapp.h
# Opt level: O0

void __thiscall ktxApp::processOptions(ktxApp *this,argparser *parser)

{
  uint uVar1;
  option *___argv;
  argparser *in_RSI;
  ktxApp *in_RDI;
  int opt;
  
  while( true ) {
    do {
      ___argv = std::vector<argparser::option,_std::allocator<argparser::option>_>::data
                          ((vector<argparser::option,_std::allocator<argparser::option>_> *)0x1208fc
                          );
      uVar1 = argparser::getopt(in_RSI,(int)in_RDI + 0x58,&___argv->name,(char *)0x0);
      if (uVar1 == 0xffffffff) {
        return;
      }
    } while (uVar1 == 0);
    if (uVar1 == 0x3a) {
      error(in_RDI,"missing required option argument.");
      (*in_RDI->_vptr_ktxApp[1])();
      exit(0);
    }
    if (uVar1 == 0x68) {
      (*in_RDI->_vptr_ktxApp[1])();
      exit(0);
    }
    if (uVar1 == 0x76) break;
    if ((uVar1 != 10000) &&
       (uVar1 = (*in_RDI->_vptr_ktxApp[3])(in_RDI,in_RSI,(ulong)uVar1), (uVar1 & 1) == 0)) {
      (*in_RDI->_vptr_ktxApp[1])();
      exit(1);
    }
  }
  printVersion((ktxApp *)0x12097b);
  exit(0);
}

Assistant:

virtual void processOptions(argparser& parser) {
        int opt;
        while ((opt = parser.getopt(&short_opts, option_list.data(), NULL)) != -1) {
            switch (opt) {
              case 0:
                break;
              case 10000:
                break;
              case 'h':
                usage();
                exit(0);
              case 'v':
                printVersion();
                exit(0);
              case ':':
                error("missing required option argument.");
                usage();
                exit(0);
              default:
                if (!processOption(parser, opt)) {
                    usage();
                    exit(1);
                }
            }
        }
#if defined(_WIN32) && defined(DEBUG)
        if (options.launchDebugger)
            launchDebugger();
#endif
    }